

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Signaler::Signaler(Signaler *this)

{
  int __fd;
  pointer __pipedes;
  SystemException *this_00;
  iterator pvVar1;
  uint local_70;
  int flags;
  value_type_conflict fd;
  iterator __end2;
  iterator __begin2;
  pipefd_t *__range2;
  allocator local_39;
  string local_38 [36];
  int local_14;
  Signaler *pSStack_10;
  int status;
  Signaler *this_local;
  
  pSStack_10 = this;
  __pipedes = std::array<int,_2UL>::data(&this->pipefd_);
  local_14 = pipe(__pipedes);
  if (local_14 != 0) {
    this_00 = (SystemException *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"pipe",&local_39);
    SystemException::SystemException(this_00,(string *)local_38,local_14);
    __cxa_throw(this_00,&SystemException::typeinfo,SystemException::~SystemException);
  }
  __end2 = std::array<int,_2UL>::begin(&this->pipefd_);
  pvVar1 = std::array<int,_2UL>::end(&this->pipefd_);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    __fd = *__end2;
    local_70 = fcntl(__fd,3,0);
    if (local_70 == 0xffffffff) {
      local_70 = 0;
    }
    fcntl(__fd,4,(ulong)(local_70 | 0x800));
  }
  return;
}

Assistant:

Signaler() {
            auto status = pipe(pipefd_.data());
            if (status) {
                throw SystemException("pipe", status);
            }
            for(auto fd : pipefd_) {
                int flags = 0;
                if (-1 == (flags = fcntl(fd, F_GETFL, 0)))
                    flags = 0;
                fcntl(fd, F_SETFL, flags | O_NONBLOCK);
            }
        }